

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_add_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  if ((line->unpacked & 2) == 0) {
    bcf_unpack(line,2);
  }
  iVar1 = (line->d).n_flt;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      if ((line->d).flt[lVar5] == flt_id) {
        return 0;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  piVar3 = &(line->d).shared_dirty;
  *(byte *)piVar3 = (byte)*piVar3 | 4;
  iVar4 = 1;
  if ((flt_id != 0) && ((iVar1 != 1 || (*(line->d).flt != 0)))) {
    iVar4 = iVar1 + 1;
  }
  (line->d).n_flt = iVar4;
  if ((line->d).m_flt < iVar4) {
    uVar2 = (int)(iVar4 - 1U) >> 1 | iVar4 - 1U;
    uVar2 = (int)uVar2 >> 2 | uVar2;
    uVar2 = (int)uVar2 >> 4 | uVar2;
    uVar2 = (int)uVar2 >> 8 | uVar2;
    uVar2 = (int)uVar2 >> 0x10 | uVar2;
    (line->d).m_flt = uVar2 + 1;
    piVar3 = (int *)realloc((line->d).flt,(long)(int)uVar2 * 4 + 4);
    (line->d).flt = piVar3;
    iVar4 = (line->d).n_flt;
  }
  else {
    piVar3 = (line->d).flt;
  }
  piVar3[(long)iVar4 + -1] = flt_id;
  return 1;
}

Assistant:

int bcf_add_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i<line->d.n_flt ) return 0;    // this filter is already set
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( flt_id==0 )    // set to PASS
        line->d.n_flt = 1;
    else if ( line->d.n_flt==1 && line->d.flt[0]==0 )
        line->d.n_flt = 1;
    else
        line->d.n_flt++;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    line->d.flt[line->d.n_flt-1] = flt_id;
    return 1;
}